

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedHandler::FlattenedField::FlattenedField
          (FlattenedField *this,StringPtr prefix,StringPtr name,
          OneOf<capnp::StructSchema::Field,_capnp::Type> *type,Reader *value)

{
  size_t sVar1;
  char *pcVar2;
  StringPtr local_38;
  char *local_28;
  size_t local_20;
  
  local_38.content.size_ = name.content.size_;
  local_38.content.ptr = name.content.ptr;
  local_20 = prefix.content.size_;
  local_28 = prefix.content.ptr;
  if (local_20 == 1) {
    (this->ownName).content.ptr = (char *)0x0;
    (this->ownName).content.size_ = 0;
    (this->ownName).content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    kj::str<kj::StringPtr&,kj::StringPtr&>
              (&this->ownName,(kj *)&local_28,&local_38,(StringPtr *)local_38.content.ptr);
    if (local_20 != 1) {
      sVar1 = (this->ownName).content.size_;
      if (sVar1 == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (this->ownName).content.ptr;
      }
      (this->name).content.ptr = pcVar2;
      (this->name).content.size_ = sVar1 + (sVar1 == 0);
      goto LAB_00292fb9;
    }
  }
  (this->name).content.ptr = local_38.content.ptr;
  (this->name).content.size_ = local_38.content.size_;
LAB_00292fb9:
  kj::OneOf<capnp::StructSchema::Field,_capnp::Type>::copyFrom(&this->type,type);
  DynamicValue::Reader::Reader(&this->value,value);
  return;
}

Assistant:

FlattenedField(kj::StringPtr prefix, kj::StringPtr name,
                   kj::OneOf<StructSchema::Field, Type> type, DynamicValue::Reader value)
        : ownName(prefix.size() > 0 ? kj::str(prefix, name) : nullptr),
          name(prefix.size() > 0 ? ownName : name),
          type(type), value(value) {}